

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Softmax::dim_forward
          (Dim *__return_storage_ptr__,Softmax *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs
          )

{
  Dim *d;
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *os;
  invalid_argument *this_00;
  string local_1b0 [32];
  ostringstream s;
  
  d = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)d != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x223,"virtual Dim cnn::Softmax::dim_forward(const vector<Dim> &) const");
  }
  bVar5 = LooksLikeVector(d);
  if (bVar5) {
    pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __return_storage_ptr__->bd = pDVar1->bd;
    uVar2 = *(undefined8 *)(pDVar1->d + 2);
    uVar3 = *(undefined8 *)(pDVar1->d + 4);
    uVar4 = *(undefined8 *)(pDVar1->d + 6);
    *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
    *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
    *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  os = std::operator<<((ostream *)&s,"Bad input dimensions in Softmax: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Softmax::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  if (!LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in Softmax: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0];
}